

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_hop(t_sigmund *x,t_floatarg f)

{
  int iVar1;
  uint uVar2;
  int hop;
  t_floatarg f_local;
  t_sigmund *x_local;
  
  uVar2 = (uint)f;
  if ((int)uVar2 < 0) {
    pd_error((void *)0x0,"sigmund~: ignoring negative hopsize %d",(ulong)uVar2);
  }
  else {
    x->x_hop = uVar2;
    if ((uVar2 != 0) &&
       (iVar1 = x->x_hop, uVar2 = sigmund_ilog2(x->x_hop), iVar1 != 1 << ((byte)uVar2 & 0x1f))) {
      uVar2 = sigmund_ilog2(x->x_hop);
      x->x_hop = 1 << ((byte)uVar2 & 0x1f);
      post("sigmund~: adjusting analysis size to %d points");
    }
  }
  return;
}

Assistant:

static void sigmund_hop(t_sigmund *x, t_floatarg f)
{
    int hop = f;
    if (hop < 0)
    {
        pd_error(0, "sigmund~: ignoring negative hopsize %d", hop);
        return;
    }
    x->x_hop = hop;
    if (0 == hop) return;
        /* check parameter ranges */
    if (x->x_hop != (1 << sigmund_ilog2(x->x_hop)))
        post("sigmund~: adjusting analysis size to %d points",
            (x->x_hop = (1 << sigmund_ilog2(x->x_hop))));
}